

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

size_t __thiscall
booster::locale::impl_icu::date_format<wchar_t>::do_parse<long>
          (date_format<wchar_t> *this,string_type *str,long *value)

{
  int32_t iVar1;
  long lVar2;
  char_type_conflict *pcVar3;
  char_type_conflict *pcVar4;
  size_t n;
  long *in_RDX;
  long in_RDI;
  double dVar5;
  size_t cut;
  double date;
  UDate udate;
  UnicodeString tmp;
  ParsePosition pp;
  ParsePosition *in_stack_ffffffffffffff00;
  char_type_conflict *in_stack_ffffffffffffff18;
  UnicodeString *str_00;
  icu_std_converter<wchar_t,_4> *in_stack_ffffffffffffff20;
  icu_std_converter<wchar_t,_4> *in_stack_ffffffffffffff28;
  double dVar6;
  double dVar7;
  ParsePosition local_70 [64];
  ParsePosition local_30 [16];
  long *local_20;
  size_t local_8;
  
  local_20 = in_RDX;
  icu_70::ParsePosition::ParsePosition(in_stack_ffffffffffffff00);
  std::__cxx11::wstring::data();
  std::__cxx11::wstring::data();
  std::__cxx11::wstring::size();
  icu_std_converter<wchar_t,_4>::icu
            (in_stack_ffffffffffffff28,(char_type_conflict *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  dVar5 = (double)icu_70::DateFormat::parse(*(UnicodeString **)(in_RDI + 0x18),local_70);
  iVar1 = icu_70::ParsePosition::getIndex(local_30);
  if (iVar1 == 0) {
    local_8 = 0;
  }
  else {
    dVar5 = dVar5 / 1000.0;
    dVar7 = dVar5;
    lVar2 = std::numeric_limits<long>::max();
    if (dVar7 <= (double)lVar2) {
      dVar6 = dVar5;
      lVar2 = std::numeric_limits<long>::min();
      if ((double)lVar2 <= dVar6) {
        pcVar3 = (char_type_conflict *)(in_RDI + 8);
        pcVar4 = (char_type_conflict *)std::__cxx11::wstring::data();
        n = std::__cxx11::wstring::data();
        lVar2 = std::__cxx11::wstring::size();
        str_00 = (UnicodeString *)(n + lVar2 * 4);
        icu_70::ParsePosition::getIndex(local_30);
        local_8 = icu_std_converter<wchar_t,_4>::cut
                            (in_stack_ffffffffffffff20,str_00,pcVar4,pcVar3,n,0,(size_t)dVar7);
        if (local_8 == 0) {
          local_8 = 0;
        }
        else {
          *local_20 = (long)dVar5;
        }
        goto LAB_0026ef85;
      }
    }
    local_8 = 0;
  }
LAB_0026ef85:
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)local_70);
  icu_70::ParsePosition::~ParsePosition(local_30);
  return local_8;
}

Assistant:

size_t do_parse(string_type const &str,ValueType &value) const
            {
                icu::ParsePosition pp;
                icu::UnicodeString tmp = cvt_.icu(str.data(),str.data() + str.size());

                UDate udate = icu_fmt_->parse(tmp,pp);
                if(pp.getIndex() == 0)
                    return 0;
                double date = udate / 1000.0;
                typedef std::numeric_limits<ValueType> limits_type;
                if(date > limits_type::max() || date < limits_type::min())
                    return 0;
                size_t cut = cvt_.cut(tmp,str.data(),str.data()+str.size(),pp.getIndex());
                if(cut==0)
                    return 0;
                value=static_cast<ValueType>(date);
                return cut;

            }